

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O1

string * __thiscall
cfd::api::HDWalletApi::CreateExtkeyFromParentPath
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type,
          ExtKeyType output_key_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_number_list)

{
  undefined8 uVar1;
  bool bVar2;
  pointer puVar3;
  CfdException *pCVar4;
  pointer puVar5;
  uint32_t uVar6;
  uint32_t version;
  string errmsg_1;
  string errmsg;
  uint32_t local_1bc;
  undefined1 local_1b8 [40];
  pointer local_190;
  pointer puStack_188;
  pointer local_180;
  pointer local_178;
  pointer puStack_170;
  pointer local_168;
  pointer local_160;
  pointer puStack_158;
  pointer puStack_150;
  pointer puStack_148;
  undefined1 local_138 [40];
  pointer local_110;
  pointer puStack_108;
  pointer local_100;
  pointer local_f8;
  pointer puStack_f0;
  pointer local_e8;
  pointer local_e0;
  pointer puStack_d8;
  pointer local_d0;
  string local_c8;
  undefined1 local_a8 [40];
  pointer local_80;
  pointer puStack_78;
  pointer puStack_70;
  pointer local_68;
  pointer puStack_60;
  pointer puStack_58;
  pointer local_50;
  pointer local_48;
  pointer puStack_40;
  pointer puStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((child_number_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (child_number_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a8._0_8_ = "cfdapi_hdwallet.cpp";
    local_a8._8_4_ = 0x92;
    local_a8._16_8_ = (long)"CfdCreateExtkeyFromParentPath" + 3;
    core::logger::log<>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"child_number_list empty."
                       );
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"child_number_list empty.","");
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_a8);
  core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_1b8,extkey);
  uVar1 = local_a8._0_8_;
  local_a8._0_8_ = local_1b8._0_8_;
  local_a8._8_8_ = local_1b8._8_8_;
  local_a8._16_8_ = local_1b8._16_8_;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (pointer)0x0;
  local_1b8._16_8_ = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1);
  }
  puVar5 = local_80;
  local_a8._24_8_ = local_1b8._24_8_;
  local_a8._32_8_ = local_1b8._32_8_;
  local_80 = local_190;
  puStack_78 = puStack_188;
  puStack_70 = local_180;
  local_190 = (pointer)0x0;
  puStack_188 = (pointer)0x0;
  local_180 = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5);
  }
  puVar5 = local_68;
  local_68 = local_178;
  puStack_60 = puStack_170;
  puStack_58 = local_168;
  local_178 = (pointer)0x0;
  puStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5);
  }
  puVar5 = local_48;
  local_50 = local_160;
  local_48 = puStack_158;
  puStack_40 = puStack_150;
  puStack_38 = puStack_148;
  puStack_158 = (pointer)0x0;
  puStack_150 = (pointer)0x0;
  puStack_148 = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5);
  }
  if (puStack_158 != (pointer)0x0) {
    operator_delete(puStack_158);
  }
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178);
  }
  if (local_190 != (pointer)0x0) {
    operator_delete(local_190);
  }
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_);
  }
  bVar2 = core::ExtPrivkey::IsValid((ExtPrivkey *)local_a8);
  if (bVar2) {
    if (output_key_type == kExtPrivkey) {
      core::ExtPrivkey::DerivePrivkey
                ((ExtPrivkey *)local_1b8,(ExtPrivkey *)local_a8,child_number_list);
      core::ExtPrivkey::ToString_abi_cxx11_((string *)local_138,(ExtPrivkey *)local_1b8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_138);
      puVar5 = puStack_158;
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_);
        puVar5 = puStack_158;
      }
    }
    else {
      core::ExtPrivkey::DerivePubkey
                ((ExtPubkey *)local_1b8,(ExtPrivkey *)local_a8,child_number_list);
      core::ExtPubkey::ToString_abi_cxx11_((string *)local_138,(ExtPubkey *)local_1b8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_138);
      puVar5 = local_160;
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_);
        puVar5 = local_160;
      }
    }
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178);
    }
    if (local_190 != (pointer)0x0) {
      operator_delete(local_190);
    }
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_);
    }
    local_1bc = core::ExtPrivkey::GetVersion((ExtPrivkey *)local_a8);
    uVar6 = 0x4358394;
    if (net_type == kLiquidV1) {
      uVar6 = 0x488ade4;
    }
    if (net_type == kMainnet) {
      uVar6 = 0x488ade4;
    }
  }
  else {
    core::ExtPubkey::ExtPubkey((ExtPubkey *)local_1b8);
    core::ExtPubkey::ExtPubkey((ExtPubkey *)local_138,extkey);
    uVar1 = local_1b8._0_8_;
    local_1b8._0_8_ = local_138._0_8_;
    local_1b8._8_8_ = local_138._8_8_;
    local_1b8._16_8_ = local_138._16_8_;
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_138._16_8_ = (pointer)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1);
    }
    puVar5 = local_190;
    local_1b8._24_8_ = local_138._24_8_;
    local_1b8._32_8_ = local_138._32_8_;
    local_190 = local_110;
    puStack_188 = puStack_108;
    local_180 = local_100;
    local_110 = (pointer)0x0;
    puStack_108 = (pointer)0x0;
    local_100 = (pointer)0x0;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    puVar5 = local_178;
    local_178 = local_f8;
    puStack_170 = puStack_f0;
    local_168 = local_e8;
    local_f8 = (pointer)0x0;
    puStack_f0 = (pointer)0x0;
    local_e8 = (pointer)0x0;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    puVar5 = local_160;
    local_160 = local_e0;
    puStack_158 = puStack_d8;
    puStack_150 = local_d0;
    local_e0 = (pointer)0x0;
    puStack_d8 = (pointer)0x0;
    local_d0 = (pointer)0x0;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    if (local_e0 != (pointer)0x0) {
      operator_delete(local_e0);
    }
    if (local_f8 != (pointer)0x0) {
      operator_delete(local_f8);
    }
    if (local_110 != (pointer)0x0) {
      operator_delete(local_110);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_);
    }
    if (output_key_type == kExtPrivkey) {
      local_138._0_8_ = "cfdapi_hdwallet.cpp";
      local_138._8_4_ = 0xbc;
      local_138._16_8_ = (long)"CfdCreateExtkeyFromParentPath" + 3;
      core::logger::log<>((CfdSourceLocation *)local_138,kCfdLogLevelWarning,
                          "Illegal output_key_type. Cannot create privkey from pubkey.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"Illegal output_key_type. Cannot create privkey from pubkey.",
                 "");
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_138);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    for (puVar3 = (child_number_list->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar3 != (child_number_list->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
      if ((int)*puVar3 < 0) {
        local_138._0_8_ = "cfdapi_hdwallet.cpp";
        local_138._8_4_ = 0xc6;
        local_138._16_8_ = (long)"CfdCreateExtkeyFromParentPath" + 3;
        core::logger::log<>((CfdSourceLocation *)local_138,kCfdLogLevelWarning,
                            "Illegal child_number. Hardened is privkey only.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,"Illegal child_number. Hardened is privkey only.","");
        core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_138);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
    }
    core::ExtPubkey::DerivePubkey((ExtPubkey *)local_138,(ExtPubkey *)local_1b8,child_number_list);
    core::ExtPubkey::ToString_abi_cxx11_(&local_c8,(ExtPubkey *)local_138);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if (local_e0 != (pointer)0x0) {
      operator_delete(local_e0);
    }
    if (local_f8 != (pointer)0x0) {
      operator_delete(local_f8);
    }
    if (local_110 != (pointer)0x0) {
      operator_delete(local_110);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_);
    }
    local_1bc = core::ExtPubkey::GetVersion((ExtPubkey *)local_1b8);
    uVar6 = 0x43587cf;
    if (net_type == kLiquidV1) {
      uVar6 = 0x488b21e;
    }
    if (net_type == kMainnet) {
      uVar6 = 0x488b21e;
    }
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160);
    }
    if (local_178 != (pointer)0x0) {
      operator_delete(local_178);
    }
    if (local_190 != (pointer)0x0) {
      operator_delete(local_190);
    }
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_);
    }
  }
  if (local_1bc != uVar6) {
    local_1b8._0_8_ = "cfdapi_hdwallet.cpp";
    local_1b8._8_4_ = 0xd2;
    local_1b8._16_8_ = (long)"CfdCreateExtkeyFromParentPath" + 3;
    core::logger::log<unsigned_int&>
              ((CfdSourceLocation *)local_1b8,kCfdLogLevelWarning,"Version unmatch. key version: {}"
               ,&local_1bc);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"extkey networkType unmatch.","");
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_1b8);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68);
  }
  if (local_80 != (pointer)0x0) {
    operator_delete(local_80);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HDWalletApi::CreateExtkeyFromParentPath(
    const std::string& extkey, NetType net_type, ExtKeyType output_key_type,
    const std::vector<uint32_t>& child_number_list) const {
  std::string result;
  uint32_t check_version;
  uint32_t version;

  if (child_number_list.empty()) {
    warn(CFD_LOG_SOURCE, "child_number_list empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "child_number_list empty.");
  }

  ExtPrivkey privkey;
  try {
    privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (privkey.IsValid()) {
    if (output_key_type == ExtKeyType::kExtPrivkey) {
      result = privkey.DerivePrivkey(child_number_list).ToString();
    } else {
      result = privkey.DerivePubkey(child_number_list).ToString();
    }
    version = privkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);

  } else {
    ExtPubkey pubkey;
    try {
      pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }

    if (output_key_type == ExtKeyType::kExtPrivkey) {
      warn(
          CFD_LOG_SOURCE,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
    }
    for (const uint32_t child_num : child_number_list) {
      // libwallyでもエラー検知されるが、エラーを把握しやすくするため確認
      if ((child_num & ExtPrivkey::kHardenedKey) != 0) {
        warn(
            CFD_LOG_SOURCE, "Illegal child_number. Hardened is privkey only.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal child_number. Hardened is privkey only.");
      }
    }
    result = pubkey.DerivePubkey(child_number_list).ToString();
    version = pubkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  }

  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return result;
}